

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O3

void __thiscall DependanceEstimator::collect(DependanceEstimator *this)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  
  (*(((this->super_Estimator).pSource)->super_Parametric)._vptr_Parametric
    [(ulong)(((this->super_Estimator).nEstimate & 0x40) == 0) + 7])();
  (*(this->xBase->super_Parametric)._vptr_Parametric
    [(ulong)(-1 < (char)(this->super_Estimator).nEstimate) + 7])();
  dVar4 = floor((extraout_XMM0_Qa_00 - this->dBegin) / this->getIncrement);
  uVar3 = (uint)dVar4;
  if ((-1 < (int)uVar3) && ((int)uVar3 < this->dependanceBins)) {
    puVar1 = &(this->super_Estimator).nSamples;
    *puVar1 = *puVar1 + 1;
    this->aSamples[uVar3] = this->aSamples[uVar3] + 1.0;
    uVar2 = (this->super_Estimator).nEstimate;
    if ((uVar2 & 4) != 0) {
      this->aOne[uVar3] = this->aOne[uVar3] + extraout_XMM0_Qa;
    }
    if ((uVar2 & 8) != 0) {
      this->aTwo[uVar3] = extraout_XMM0_Qa * extraout_XMM0_Qa + this->aTwo[uVar3];
    }
    if ((uVar2 & 0x10) != 0) {
      this->aThree[uVar3] =
           extraout_XMM0_Qa * extraout_XMM0_Qa * extraout_XMM0_Qa + this->aThree[uVar3];
    }
    if ((((uVar2 & 2) != 0) && (this->dDistBegin <= extraout_XMM0_Qa)) &&
       (extraout_XMM0_Qa <= this->dDistDelta)) {
      dVar4 = floor((extraout_XMM0_Qa - this->dDistBegin) / this->dDistDelta);
      this->aDist[uVar3][(int)dVar4] = this->aDist[uVar3][(int)dVar4] + 1.0;
    }
  }
  return;
}

Assistant:

void DependanceEstimator::collect()
{
	// find appropriate bin
	double base, source;
	if (nEstimate & EST_DIFF)
		source = pSource->getIncrement();
	 else
		source = pSource->getCurrentValue();
	if (nEstimate & EST_BASE_DIFF)
		base = xBase->getIncrement();
	else
		base = xBase->getCurrentValue();
	int n = int(floor((base - dBegin) / getIncrement));
	
	// check if base value is in bounds
	if (n<0 || n>=dependanceBins)
		return;
		
	// record sample
	++nSamples;
	++aSamples[n];
	if (nEstimate & EST_MEAN)
		aOne[n] += source;
	if (nEstimate & EST_VAR)
		aTwo[n] += source*source;
	if (nEstimate & EST_CUR)
		aThree[n] += source*source*source;
	if (nEstimate & EST_DENS) {
		if (source < dDistBegin || source > dDistDelta)
			return;
		int m = int (floor((source - dDistBegin) / dDistDelta));
		++aDist[n][m];
	}
}